

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O0

bool __thiscall Imf_3_3::KeyCode::operator==(KeyCode *this,KeyCode *other)

{
  bool local_11;
  KeyCode *other_local;
  KeyCode *this_local;
  
  local_11 = false;
  if ((((this->_filmMfcCode == other->_filmMfcCode) &&
       (local_11 = false, this->_filmType == other->_filmType)) &&
      (local_11 = false, this->_prefix == other->_prefix)) &&
     (((local_11 = false, this->_count == other->_count &&
       (local_11 = false, this->_perfOffset == other->_perfOffset)) &&
      (local_11 = false, this->_perfsPerFrame == other->_perfsPerFrame)))) {
    local_11 = this->_perfsPerCount == other->_perfsPerCount;
  }
  return local_11;
}

Assistant:

bool
KeyCode::operator== (const KeyCode& other) const
{
    return (_filmMfcCode   == other._filmMfcCode &&
            _filmType      == other._filmType &&
            _prefix        == other._prefix &&
            _count         == other._count &&
            _perfOffset    == other._perfOffset &&
            _perfsPerFrame == other._perfsPerFrame &&
            _perfsPerCount == other._perfsPerCount);
}